

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddiEa<(moira::Instr)6,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  u32 uVar4;
  undefined8 in_RAX;
  u32 val;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  bVar1 = (byte)(this->queue).irc;
  local_28 = in_RAX;
  readExt(this);
  bVar3 = readOp<(moira::Mode)3,(moira::Size)1,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  if (bVar3) {
    val = (u32)local_28 + bVar1;
    bVar3 = (bool)((byte)(val >> 8) & 1);
    (this->reg).sr.c = bVar3;
    (this->reg).sr.x = bVar3;
    bVar2 = (byte)val;
    (this->reg).sr.v = (bool)((byte)(((byte)local_28 ^ bVar2) & (bVar1 ^ bVar2)) >> 7);
    (this->reg).sr.z = bVar2 == 0;
    (this->reg).sr.n = (bool)(bVar2 >> 7);
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_28._4_4_,val);
  }
  return;
}

Assistant:

void
Moira::execAddiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch();

    writeOp<M,S, POLLIPL>(dst, ea, result);
}